

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

ExpEmit __thiscall FxGetDefaultByType::Emit(FxGetDefaultByType *this,VMFunctionBuilder *build)

{
  uint uVar1;
  uint uVar2;
  uint opc;
  uint extraout_var;
  ExpEmit EVar3;
  
  uVar1 = (*this->Self->_vptr_FxExpression[9])();
  if (((extraout_var & 0x100) == 0) && ((uVar1 & 0xfc0000) == 0 && (extraout_var & 1) == 0)) {
    VMFunctionBuilder::RegAvailability::Return
              (build->Registers + ((uint)(CONCAT44(extraout_var,uVar1) >> 0x10) & 3),uVar1 & 0xffff,
               uVar1 >> 0x18);
  }
  uVar2 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 3,1);
  if ((extraout_var & 1) != 0) {
    VMFunctionBuilder::Emit(build,5,uVar2 & 0xffff,(VM_SHALF)uVar1);
    uVar1 = uVar2;
  }
  opc = VMFunctionBuilder::GetConstantInt(build,0xe8);
  VMFunctionBuilder::Emit(build,0x1c,uVar2 & 0xffff,uVar1 & 0xffff,opc);
  EVar3._0_4_ = uVar2 & 0xffff | 0x1030000;
  EVar3.Konst = false;
  EVar3.Fixed = false;
  EVar3.Final = false;
  EVar3.Target = false;
  return EVar3;
}

Assistant:

ExpEmit FxGetDefaultByType::Emit(VMFunctionBuilder *build)
{
	ExpEmit op = Self->Emit(build);
	op.Free(build);
	ExpEmit to(build, REGT_POINTER);
	if (op.Konst)
	{
		build->Emit(OP_LKP, to.RegNum, op.RegNum);
		op = to;
	}
	build->Emit(OP_LO, to.RegNum, op.RegNum, build->GetConstantInt(myoffsetof(PClass, Defaults)));
	return to;
}